

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O2

void tabread_float(t_tabread *x,t_float f)

{
  int iVar1;
  int iVar2;
  _garray *x_00;
  int iVar3;
  t_float f_00;
  int npoints;
  t_word *vec;
  int local_14;
  t_word *local_10;
  
  x_00 = (_garray *)pd_findbyclass(x->x_arrayname,garray_class);
  if (x_00 != (_garray *)0x0) {
    iVar1 = garray_getfloatwords(x_00,&local_14,&local_10);
    if (iVar1 == 0) {
      pd_error(x,"%s: bad template for tabread",x->x_arrayname->s_name);
    }
    else {
      if (local_14 == 0) {
        f_00 = 0.0;
      }
      else {
        iVar3 = (int)f;
        iVar1 = local_14 + -1;
        if (iVar3 < local_14) {
          iVar1 = iVar3;
        }
        iVar2 = 0;
        if (-1 < iVar3) {
          iVar2 = iVar1;
        }
        f_00 = local_10[iVar2].w_float;
      }
      outlet_float((x->x_obj).te_outlet,f_00);
    }
    return;
  }
  pd_error(x,"%s: no such array",x->x_arrayname->s_name);
  return;
}

Assistant:

static void tabread_float(t_tabread *x, t_float f)
{
    t_garray *a;
    int npoints;
    t_word *vec;

    if (!(a = (t_garray *)pd_findbyclass(x->x_arrayname, garray_class)))
        pd_error(x, "%s: no such array", x->x_arrayname->s_name);
    else if (!garray_getfloatwords(a, &npoints, &vec))
        pd_error(x, "%s: bad template for tabread", x->x_arrayname->s_name);
    else
    {
        int n = f;
        if (n < 0) n = 0;
        else if (n >= npoints) n = npoints - 1;
        outlet_float(x->x_obj.ob_outlet, (npoints ? vec[n].w_float : 0));
    }
}